

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationshipRecord.h
# Opt level: O2

void __thiscall
KDIS::PDU::IsPartOf_PDU::SetRelationshipRecord(IsPartOf_PDU *this,RelationshipRecord *RR)

{
  KUINT16 KVar1;
  
  KVar1 = RR->m_ui16Pos;
  (this->m_RelRec).m_ui16Nature = RR->m_ui16Nature;
  (this->m_RelRec).m_ui16Pos = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT RelationshipRecord : public DataTypeBase
{
protected:

    KUINT16 m_ui16Nature;

    KUINT16 m_ui16Pos;

public:

    static const KUINT16 RELATIONSHIP_RECORD_SIZE = 4;

    RelationshipRecord();

    RelationshipRecord(KDataStream &stream) noexcept(false);

    RelationshipRecord( KDIS::DATA_TYPE::ENUMS::RelationshipNature N, KDIS::DATA_TYPE::ENUMS::RelationshipPosition P );

    virtual ~RelationshipRecord();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelationshipRecord::SetNature
    //              KDIS::DATA_TYPE::RelationshipRecord::GetNature
    // Description: Nature or purpose for joining of the part entity to the host
    //              entity within a IsPartOf PDU.
    // Parameter:   RelationshipNature N
    //************************************
    void SetNature( KDIS::DATA_TYPE::ENUMS::RelationshipNature N );
    KDIS::DATA_TYPE::ENUMS::RelationshipNature GetNature() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelationshipRecord::SetPosition
    //              KDIS::DATA_TYPE::RelationshipRecord::GetPosition
    // Description: Specifies the position of the part entity with respect to the host
    //              entity within a IsPartOf PDU.
    // Parameter:   RelationshipPosition P
    //************************************
    void SetPosition( KDIS::DATA_TYPE::ENUMS::RelationshipPosition P );
    KDIS::DATA_TYPE::ENUMS::RelationshipPosition GetPosition() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelationshipRecord::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelationshipRecord::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::RelationshipRecord::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const RelationshipRecord & Value ) const;
    KBOOL operator != ( const RelationshipRecord & Value ) const;
}